

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

string * __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::getType_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<pbrt::syntactic::Texture> *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->type)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->type)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual size_t getSize() const { return 1; }